

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,4>,tcu::Vector<int,4>>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>_>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  pointer pVVar2;
  pointer pVVar3;
  Variable<tcu::Vector<float,_4>_> *pVVar4;
  pointer pcVar5;
  Variable<tcu::Vector<int,_4>_> *pVVar6;
  PrecisionCase *pPVar7;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>_>_>
  *pVVar8;
  undefined8 uVar9;
  bool bVar10;
  bool bVar11;
  ContextType type;
  int iVar12;
  uint uVar13;
  _Rb_tree_node_base *p_Var14;
  char *__s;
  size_t sVar15;
  long *plVar16;
  ShaderExecutor *pSVar17;
  long lVar18;
  IVal *pIVar19;
  IVal *pIVar20;
  TestError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  Vector<float,_4> *val;
  size_t sVar22;
  MessageBuilder *pMVar23;
  ulong uVar24;
  byte bVar25;
  IVal in2;
  IVal in3;
  IVal in1;
  ostringstream os;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>_>_>
  outputs;
  Environment env;
  FuncSet funcs;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_588 [8];
  PrecisionCase *local_580;
  string local_578;
  Statement *local_550;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>_>_>
  *local_548;
  string local_540;
  size_t local_520;
  ulong local_518;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_510;
  FloatFormat *local_508;
  undefined1 local_500 [16];
  undefined1 local_4f0 [88];
  undefined1 local_498 [8];
  pointer pVStack_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  double local_478;
  Data local_470;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  FloatFormat local_318;
  ulong local_2e8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>_>_>
  local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2b0;
  undefined1 local_280 [16];
  _Base_ptr local_270;
  _Rb_tree_node_base *local_268;
  _Rb_tree_node_base *local_260;
  double local_258;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar25 = 0;
  pVVar2 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  sVar22 = (long)pVVar3 - (long)pVVar2 >> 4;
  local_550 = stmt;
  local_510 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>_>_>
  ::Outputs(&local_2e0,sVar22);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_318.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_318.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_318.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_318.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_318.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_318.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_318.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_318.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_318._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b0._M_impl.super__Rb_tree_header._M_header;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_580 = this;
  local_2b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_490);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"Statement: ",0xb);
  (*local_550->_vptr_Statement[2])(local_550,(ostringstream *)&pVStack_490);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_520 = sVar22;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_490);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_280 + 8);
  local_280._8_4_ = _S_red;
  local_270 = (_Base_ptr)0x0;
  local_258 = 0.0;
  local_268 = p_Var1;
  local_260 = p_Var1;
  (*local_550->_vptr_Statement[4])(local_550,local_280);
  if (local_268 != p_Var1) {
    p_Var14 = local_268;
    do {
      (**(code **)(**(long **)(p_Var14 + 1) + 0x30))(*(long **)(p_Var14 + 1),local_1a8);
      p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
    } while (p_Var14 != p_Var1);
  }
  if (local_258 != 0.0) {
    local_498 = (undefined1  [8])((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_490);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_490,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_490,(char *)local_500._0_8_,local_500._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
      operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_490);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_280);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"precision ",10);
  __s = glu::getPrecisionName((local_580->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_588 + *(long *)((long)local_498 + -0x18)) + 0xf0);
  }
  else {
    sVar15 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,__s,sVar15);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar5 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_580->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  local_548 = variables;
  if ((local_580->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_580->m_extension);
    plVar16 = (long *)std::__cxx11::string::append(local_1a8);
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 == paVar21) {
      local_488._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_488._8_8_ = plVar16[3];
      local_498 = (undefined1  [8])&local_488;
    }
    else {
      local_488._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_498 = (undefined1  [8])*plVar16;
    }
    pVStack_490 = (pointer)plVar16[1];
    *plVar16 = (long)paVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_498);
    if (local_498 != (undefined1  [8])&local_488) {
      operator_delete((void *)local_498,local_488._M_allocated_capacity + 1);
    }
    variables = local_548;
    if ((pointer)local_1a8._0_8_ != pcVar5) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),1);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_498,local_580,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar9 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_498);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if (local_498 != (undefined1  [8])&local_488) {
    operator_delete((void *)local_498,local_488._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),2);
  makeSymbol<tcu::Vector<int,4>>
            ((Symbol *)local_498,local_580,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<int,_4>_>_>
             .m_ptr);
  uVar9 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)(local_220._32_8_ + 0x38),(string *)local_498);
  glu::VarType::operator=(&((pointer)(uVar9 + 0x38))->varType,(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if (local_498 != (undefined1  [8])&local_488) {
    operator_delete((void *)local_498,local_488._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_498,local_580,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar9 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_498);
  glu::VarType::operator=((VarType *)(uVar9 + 0x20),(VarType *)&local_478);
  glu::VarType::~VarType((VarType *)&local_478);
  if (local_498 != (undefined1  [8])&local_488) {
    operator_delete((void *)local_498,local_488._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  (*local_550->_vptr_Statement[2])(local_550,local_498);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar5) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar7 = local_580;
  pSVar17 = ShaderExecUtil::createExecutor
                      ((local_580->m_ctx).renderContext,(local_580->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  sVar22 = local_520;
  local_498 = (undefined1  [8])
              (local_510->in0).
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  pVStack_490 = (local_510->in1).
                super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_488._M_allocated_capacity =
       (size_type)
       (local_510->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_488._8_8_ =
       (local_510->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_2e0.out0.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_2e0.out1.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar17->_vptr_ShaderExecutor[3])
            (pSVar17,((pPVar7->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar12 = (*pSVar17->_vptr_ShaderExecutor[2])(pSVar17);
  if ((char)iVar12 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar17->_vptr_ShaderExecutor[5])(pSVar17);
  (*pSVar17->_vptr_ShaderExecutor[6])(pSVar17,sVar22 & 0xffffffff,local_498,local_1a8);
  local_508 = &(pPVar7->m_ctx).floatFormat;
  (*pSVar17->_vptr_ShaderExecutor[1])(pSVar17);
  lVar18 = 8;
  do {
    local_4f0[lVar18 + 0x50] = 0;
    *(undefined8 *)(local_498 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pVStack_490 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x68);
  lVar18 = 8;
  do {
    local_4f0[lVar18 + 0x50] = 0;
    *(undefined8 *)(local_498 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)((long)&pVStack_490 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x68);
  lVar18 = 8;
  do {
    local_1a8[lVar18 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x68);
  lVar18 = 8;
  do {
    local_1a8[lVar18 + -8] = 0;
    *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x68);
  lVar18 = 8;
  do {
    local_280[lVar18 + -8] = 0;
    *(undefined8 *)(local_280 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_280 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x68);
  lVar18 = 8;
  do {
    local_280[lVar18 + -8] = 0;
    *(undefined8 *)(local_280 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_280 + lVar18 + 8) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x68);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2b0,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_498);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b0,
             (variables->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_500);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b0,
             (variables->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_578);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b0,
             (variables->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_540);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2b0,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<tcu::Vector<int,4>>
            ((Environment *)&local_2b0,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<int,_4>_>_>
             .m_ptr,(IVal *)local_280);
  if (pVVar3 == pVVar2) {
LAB_017f2523:
    local_498 = (undefined1  [8])((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_490);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_490);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_490," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4f0._80_8_ = &local_580->m_status;
    local_2e8 = sVar22 + (sVar22 == 0);
    uVar24 = 0;
    local_518 = 0;
    do {
      lVar18 = 8;
      do {
        local_1a8[lVar18 + -8] = 0;
        *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x68);
      lVar18 = 8;
      do {
        local_1a8[lVar18 + -8] = 0;
        *(undefined8 *)(local_1a8 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar18 + 8) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x68);
      lVar18 = 8;
      do {
        local_280[lVar18 + -8] = 0;
        *(undefined8 *)(local_280 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(local_280 + lVar18 + 8) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x68);
      lVar18 = 8;
      do {
        local_280[lVar18 + -8] = 0;
        *(undefined8 *)(local_280 + lVar18) = 0x7ff0000000000000;
        *(undefined8 *)(local_280 + lVar18 + 8) = 0xfff0000000000000;
        lVar18 = lVar18 + 0x18;
      } while (lVar18 != 0x68);
      if ((uVar24 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_580->super_TestCase).super_TestNode.m_testCtx);
      }
      pVVar2 = (local_510->in0).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar24;
      local_578._M_dataplus._M_p = *(pointer *)pVVar2->m_data;
      local_578._M_string_length = *(size_type *)(pVVar2->m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_500,local_508,(Vector<float,_4> *)&local_578);
      pVVar8 = local_548;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,local_508,(IVal *)local_500);
      pIVar19 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2b0,
                           (pVVar8->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar23 = (MessageBuilder *)local_498;
      for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(TestLog **)pIVar19->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar25 * -0x10 + 8);
        pIVar19 = (IVal *)((long)pIVar19 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b0,
                 (pVVar8->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b0,
                 (pVVar8->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b0,
                 (pVVar8->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_470.basic.type = (local_580->m_ctx).precision;
      local_478 = local_508->m_maxValue;
      local_498 = *(undefined1 (*) [8])local_508;
      pVStack_490 = *(pointer *)&local_508->m_fractionBits;
      local_488._M_allocated_capacity = *(undefined8 *)&local_508->m_hasInf;
      local_488._8_8_ = *(undefined8 *)&local_508->m_exactPrecision;
      local_460 = 0;
      local_470._8_8_ = &local_2b0;
      (*local_550->_vptr_Statement[3])(local_550,(MessageBuilder *)local_498);
      pIVar20 = Environment::lookup<tcu::Vector<int,4>>
                          ((Environment *)&local_2b0,
                           (pVVar8->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<int,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<int,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,&local_318,pIVar20);
      pMVar23 = (MessageBuilder *)local_498;
      pIVar20 = (IVal *)local_280;
      for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(TestLog **)pIVar20->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar25 * -0x10 + 8);
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      bVar10 = contains<tcu::Vector<int,4>>
                         ((IVal *)local_280,
                          local_2e0.out1.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar24);
      local_498 = (undefined1  [8])&local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 1 is outside acceptable range","");
      bVar10 = tcu::ResultCollector::check
                         ((ResultCollector *)local_4f0._80_8_,bVar10,(string *)local_498);
      if (local_498 != (undefined1  [8])&local_488) {
        operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
      }
      pIVar19 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2b0,
                           (local_548->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,&local_318,pIVar19);
      pMVar23 = (MessageBuilder *)local_498;
      pIVar19 = (IVal *)local_1a8;
      for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
        *(TestLog **)pIVar19->m_data = pMVar23->m_log;
        pMVar23 = (MessageBuilder *)((long)pMVar23 + (ulong)bVar25 * -0x10 + 8);
        pIVar19 = (IVal *)((long)pIVar19 + ((ulong)bVar25 * -2 + 1) * 8);
      }
      bVar11 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_1a8,
                          local_2e0.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar24);
      local_498 = (undefined1  [8])&local_488;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check
                         ((ResultCollector *)local_4f0._80_8_,bVar11,(string *)local_498);
      if (local_498 != (undefined1  [8])&local_488) {
        operator_delete((void *)local_498,(ulong)(local_488._M_allocated_capacity + 1));
      }
      pVVar8 = local_548;
      if (!bVar10 || !bVar11) {
        uVar13 = (int)local_518 + 1;
        local_518 = (ulong)uVar13;
        if ((int)uVar13 < 0x65) {
          local_498 = (undefined1  [8])((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log
          ;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_490);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490," sample:\n",9)
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"\t",1);
          pVVar4 = (pVVar8->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          val = (Vector<float,_4> *)local_4f0;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_500._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_490,(char *)local_500._0_8_,local_500._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490," = ",3);
          valueToString<tcu::Vector<float,4>>
                    (&local_578,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     ((local_510->in0).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar24),val);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_490,local_578._M_dataplus._M_p,local_578._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          }
          if ((Vector<float,_4> *)local_500._0_8_ != (Vector<float,_4> *)local_4f0) {
            operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"\t",1);
          pVVar4 = (pVVar8->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                   .m_ptr;
          pIVar19 = (IVal *)local_4f0;
          pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
          local_500._0_8_ = pIVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_490,(char *)local_500._0_8_,local_500._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490," = ",3);
          valueToString<tcu::Vector<float,4>>
                    (&local_578,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     (local_2e0.out0.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar24),
                     (Vector<float,_4> *)pIVar19);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_490,local_578._M_dataplus._M_p,local_578._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_490,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,4>>
                    (&local_540,(BuiltinPrecisionTests *)&local_318,(FloatFormat *)local_1a8,pIVar19
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_490,local_540._M_dataplus._M_p,local_540._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != &local_540.field_2) {
            operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
            operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"\t",1);
          pVVar6 = (pVVar8->out1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<int,_4>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_4f0;
          pcVar5 = (pVVar6->m_name)._M_dataplus._M_p;
          local_500._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_500,pcVar5,pcVar5 + (pVVar6->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_490,(char *)local_500._0_8_,local_500._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490," = ",3);
          valueToString<tcu::Vector<int,4>>
                    (&local_578,(BuiltinPrecisionTests *)&local_318,
                     (FloatFormat *)
                     (local_2e0.out1.
                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar24),(Vector<int,_4> *)pIVar20)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_490,local_578._M_dataplus._M_p,local_578._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_490,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<int,4>>
                    (&local_540,(BuiltinPrecisionTests *)&local_318,(FloatFormat *)local_280,pIVar20
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pVStack_490,local_540._M_dataplus._M_p,local_540._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._M_dataplus._M_p != &local_540.field_2) {
            operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_578._M_dataplus._M_p != &local_578.field_2) {
            operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_500._0_8_ != (IVal *)local_4f0) {
            operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_490);
          std::ios_base::~ios_base(local_420);
        }
      }
      uVar24 = uVar24 + 1;
    } while (uVar24 != local_2e8);
    iVar12 = (int)local_518;
    if (iVar12 < 0x65) {
      if (iVar12 == 0) goto LAB_017f2523;
    }
    else {
      local_498 = (undefined1  [8])((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_490);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&pVStack_490,iVar12 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_490);
      std::ios_base::~ios_base(local_420);
    }
    local_498 = (undefined1  [8])((local_580->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pVStack_490);
    std::ostream::operator<<((ostringstream *)&pVStack_490,iVar12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pVStack_490,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&pVStack_490);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pVStack_490," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pVStack_490);
  std::ios_base::~ios_base(local_420);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_2e0.out1.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.out1.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.out1.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.out1.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e0.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}